

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O1

void OpenMesh::IO::assignCustomProperty<double>
               (istream *_in,BaseImporter *_bi,VertexHandle _vh,string *_propName)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar2;
  double local_40;
  double in;
  BaseHandle local_2c [2];
  VPropHandleT<double> prop;
  
  local_2c[0].idx_ = -1;
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  local_40 = 0.0;
  local_2c[0].idx_ =
       (int)PropertyContainer::handle<double>
                      ((PropertyContainer *)(CONCAT44(extraout_var,iVar1) + 8),&local_40,_propName);
  if (local_2c[0].idx_ == -1) {
    iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
    BaseKernel::add_property<double>
              ((BaseKernel *)CONCAT44(extraout_var_00,iVar1),(VPropHandleT<double> *)local_2c,
               _propName);
  }
  std::istream::_M_extract<double>((double *)_in);
  in = local_40;
  iVar1 = (*_bi->_vptr_BaseImporter[0x19])(_bi);
  pvVar2 = BaseKernel::property<double>
                     ((BaseKernel *)CONCAT44(extraout_var_01,iVar1),
                      (VPropHandleT<double>)local_2c[0].idx_,_vh);
  *pvVar2 = in;
  return;
}

Assistant:

void assignCustomProperty(std::istream& _in, BaseImporter& _bi, VertexHandle _vh, const std::string& _propName)
{
  OpenMesh::VPropHandleT<T> prop;
  if (!_bi.kernel()->get_property_handle(prop,_propName))
    _bi.kernel()->add_property(prop,_propName);
  T in;
  _in >> in;
  _bi.kernel()->property(prop,_vh) = in;
}